

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_vmstat(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int vnum;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *ch_00;
  char *txt;
  char arg [4608];
  char buf [4608];
  
  one_argument(argument,arg);
  if ((arg[0] == '\0') || (bVar1 = is_number(arg), !bVar1)) {
    txt = "Syntax: vstat mob [vnum]\n\r";
  }
  else {
    vnum = atoi(arg);
    pMobIndex = get_mob_index(vnum);
    if (pMobIndex != (MOB_INDEX_DATA *)0x0) {
      ch_00 = create_mobile(pMobIndex);
      char_to_room(ch_00,ch->in_room);
      strcpy(buf,ch_00->name);
      do_mstat(ch,buf);
      extract_char(ch_00,true);
      return;
    }
    txt = "No mob has that vnum.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_vmstat(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	MOB_INDEX_DATA *pMobIndex;
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (arg[0] == '\0' || !is_number(arg))
	{
		send_to_char("Syntax: vstat mob [vnum]\n\r", ch);
		return;
	}

	pMobIndex = get_mob_index(atoi(arg));

	if (pMobIndex == nullptr)
	{
		send_to_char("No mob has that vnum.\n\r", ch);
		return;
	}

	victim = create_mobile(pMobIndex);

	char_to_room(victim, ch->in_room);

	sprintf(buf, "%s", victim->name);
	do_mstat(ch, buf);

	extract_char(victim, true);
}